

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_mul_mat(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b)

{
  _Bool _Var1;
  ggml_tensor *pgVar2;
  char *pcVar3;
  int line;
  int64_t local_38;
  int64_t local_30;
  int64_t iStack_28;
  int64_t local_20;
  
  _Var1 = ggml_can_mul_mat(a,b);
  if (_Var1) {
    if (a->nb[0] <= a->nb[1]) {
      local_38 = a->ne[1];
      local_30 = b->ne[1];
      iStack_28 = b->ne[2];
      local_20 = b->ne[3];
      pgVar2 = ggml_new_tensor(ctx,GGML_TYPE_F32,4,&local_38);
      pgVar2->op = GGML_OP_MUL_MAT;
      pgVar2->src[0] = a;
      pgVar2->src[1] = b;
      return pgVar2;
    }
    pcVar3 = "!ggml_is_transposed(a)";
    line = 0xab8;
  }
  else {
    pcVar3 = "ggml_can_mul_mat(a, b)";
    line = 0xab7;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
             ,line,"GGML_ASSERT(%s) failed",pcVar3);
}

Assistant:

struct ggml_tensor * ggml_mul_mat(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b) {
    GGML_ASSERT(ggml_can_mul_mat(a, b));
    GGML_ASSERT(!ggml_is_transposed(a));

    const int64_t ne[4] = { a->ne[1], b->ne[1], b->ne[2], b->ne[3] };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    result->op     = GGML_OP_MUL_MAT;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}